

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  long in_RDI;
  ZSTD_DCtx *in_stack_00000040;
  ZSTD_longOffset_e in_stack_00000300;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x7150) == 0) {
    local_8 = ZSTD_decompressSequences_default
                        (in_stack_00000040,dctx,(size_t)dst,(void *)maxDstSize,(size_t)seqStart,
                         seqSize._4_4_,in_stack_00000300);
  }
  else {
    local_8 = ZSTD_decompressSequences_bmi2
                        (in_stack_00000040,dctx,(size_t)dst,(void *)maxDstSize,(size_t)seqStart,
                         seqSize._4_4_,in_stack_00000300);
  }
  return local_8;
}

Assistant:

static size_t ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                const void* seqStart, size_t seqSize, int nbSeq,
                                const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}